

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

void sen_BLOCK(treeNode *tn)

{
  bool bVar1;
  treeNode *ptVar2;
  allocator local_169;
  string local_168 [32];
  treeNode *local_148;
  treeNode *complex_sent;
  string local_138 [32];
  treeNode *local_118;
  treeNode *write_sent;
  string local_108 [32];
  treeNode *local_e8;
  treeNode *read_sent;
  string local_d8 [32];
  treeNode *local_b8;
  treeNode *proc_call_sent;
  string local_a8 [32];
  treeNode *local_88;
  treeNode *do_while_sent;
  string local_78 [32];
  treeNode *local_58;
  treeNode *condition_sent;
  allocator local_39;
  string local_38 [32];
  treeNode *local_18;
  treeNode *assi_sent;
  treeNode *tn_local;
  
  assi_sent = tn;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          sym_abi_cxx11_,"identifier");
  if (bVar1) {
    ptVar2 = (treeNode *)operator_new(0x38);
    condition_sent._3_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,anon_var_dwarf_6b24,&local_39);
    treeNode::treeNode(ptVar2,(string *)local_38);
    condition_sent._3_1_ = 0;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    local_18 = ptVar2;
    std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&assi_sent->child,&local_18);
    assi_sen(local_18);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            sym_abi_cxx11_,"if");
    if (bVar1) {
      ptVar2 = (treeNode *)operator_new(0x38);
      do_while_sent._6_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,anon_var_dwarf_6b2f,(allocator *)((long)&do_while_sent + 7));
      treeNode::treeNode(ptVar2,(string *)local_78);
      do_while_sent._6_1_ = 0;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&do_while_sent + 7));
      local_58 = ptVar2;
      std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&assi_sent->child,&local_58);
      condition_sen(local_58);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              sym_abi_cxx11_,"while");
      if (bVar1) {
        ptVar2 = (treeNode *)operator_new(0x38);
        proc_call_sent._6_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_a8,anon_var_dwarf_6b3a,(allocator *)((long)&proc_call_sent + 7));
        treeNode::treeNode(ptVar2,(string *)local_a8);
        proc_call_sent._6_1_ = 0;
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&proc_call_sent + 7));
        local_88 = ptVar2;
        std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back(&assi_sent->child,&local_88)
        ;
        do_while_sen(local_88);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )sym_abi_cxx11_,"call");
        if (bVar1) {
          ptVar2 = (treeNode *)operator_new(0x38);
          read_sent._6_1_ = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_d8,anon_var_dwarf_6b45,(allocator *)((long)&read_sent + 7));
          treeNode::treeNode(ptVar2,(string *)local_d8);
          read_sent._6_1_ = 0;
          std::__cxx11::string::~string(local_d8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&read_sent + 7));
          local_b8 = ptVar2;
          std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back
                    (&assi_sent->child,&local_b8);
          proc_call_sen(local_b8);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)sym_abi_cxx11_,"read");
          if (bVar1) {
            ptVar2 = (treeNode *)operator_new(0x38);
            write_sent._6_1_ = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_108,anon_var_dwarf_6b50,(allocator *)((long)&write_sent + 7));
            treeNode::treeNode(ptVar2,(string *)local_108);
            write_sent._6_1_ = 0;
            std::__cxx11::string::~string(local_108);
            std::allocator<char>::~allocator((allocator<char> *)((long)&write_sent + 7));
            local_e8 = ptVar2;
            std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back
                      (&assi_sent->child,&local_e8);
            read_sen(local_e8);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)sym_abi_cxx11_,"write");
            if (bVar1) {
              ptVar2 = (treeNode *)operator_new(0x38);
              complex_sent._6_1_ = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_138,anon_var_dwarf_6b5b,(allocator *)((long)&complex_sent + 7));
              treeNode::treeNode(ptVar2,(string *)local_138);
              complex_sent._6_1_ = 0;
              std::__cxx11::string::~string(local_138);
              std::allocator<char>::~allocator((allocator<char> *)((long)&complex_sent + 7));
              local_118 = ptVar2;
              std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back
                        (&assi_sent->child,&local_118);
              write_sen(local_118);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)sym_abi_cxx11_,"begin");
              if (bVar1) {
                ptVar2 = (treeNode *)operator_new(0x38);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_168,anon_var_dwarf_6b66,&local_169);
                treeNode::treeNode(ptVar2,(string *)local_168);
                std::__cxx11::string::~string(local_168);
                std::allocator<char>::~allocator((allocator<char> *)&local_169);
                local_148 = ptVar2;
                std::vector<treeNode_*,_std::allocator<treeNode_*>_>::push_back
                          (&assi_sent->child,&local_148);
                complex_sen(local_148);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void sen_BLOCK(treeNode* tn)
{
    if (sym == "identifier") {
        auto *assi_sent = new treeNode("赋值语句");
        tn->child.push_back(assi_sent);
        assi_sen(assi_sent);
    }
    else if (sym == "if") {
        auto *condition_sent = new treeNode("条件语句");
        tn->child.push_back(condition_sent);
        condition_sen(condition_sent);
    }
    else if (sym == "while") {
        auto *do_while_sent = new treeNode("当型循环语句");
        tn->child.push_back(do_while_sent);
        do_while_sen(do_while_sent);
    }
    else if (sym == "call") {
        auto *proc_call_sent = new treeNode("过程调用语句");
        tn->child.push_back(proc_call_sent);
        proc_call_sen(proc_call_sent);
    }
    else if (sym == "read") {
        auto *read_sent = new treeNode("读语句");
        tn->child.push_back(read_sent);
        read_sen(read_sent);
    }
    else if (sym == "write") {
        auto *write_sent = new treeNode("写语句");
        tn->child.push_back(write_sent);
        write_sen(write_sent);
    }
    else if (sym == "begin") {
        auto *complex_sent = new treeNode("复合语句");
        tn->child.push_back(complex_sent);
        complex_sen(complex_sent);
    }
}